

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

bool __thiscall btLemkeAlgorithm::greaterZero(btLemkeAlgorithm *this,btVectorXf *vector)

{
  float *pfVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (vector->m_storage).m_size;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  do {
    uVar5 = uVar3;
    if (uVar4 == uVar5) break;
    pfVar1 = (vector->m_storage).m_data + uVar5;
    uVar3 = uVar5 + 1;
  } while (0.0 < *pfVar1 || *pfVar1 == 0.0);
  return (long)(int)uVar2 <= (long)uVar5;
}

Assistant:

bool btLemkeAlgorithm::greaterZero(const btVectorXu & vector)
{
    bool isGreater = true;
    for (int i = 0; i < vector.size(); i++) {
      if (vector[i] < 0) {
        isGreater = false;
        break;
      }
    }

    return isGreater;
  }